

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::ProcessDeleteAcceptIgnoreEntry
          (RTPUDPv4Transmitter *this,uint32_t ip,uint16_t port)

{
  PortInfo *pPVar1;
  bool bVar2;
  PortInfo **ppPVar3;
  reference puVar4;
  reference puVar5;
  const_iterator local_98;
  _List_node_base *local_90;
  _List_node_base *local_88;
  _List_iterator<unsigned_short> local_80;
  iterator end_1;
  iterator begin_1;
  iterator it_1;
  iterator local_60;
  _List_const_iterator<unsigned_short> local_58;
  iterator local_50;
  _List_const_iterator<unsigned_short> local_48;
  _List_const_iterator<unsigned_short> local_40;
  const_iterator end;
  const_iterator begin;
  const_iterator it;
  PortInfo *inf;
  uint16_t port_local;
  RTPUDPv4Transmitter *pRStack_18;
  uint32_t ip_local;
  RTPUDPv4Transmitter *this_local;
  
  inf._2_2_ = port;
  inf._4_4_ = ip;
  pRStack_18 = this;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::GotoElement(&this->acceptignoreinfo,(uint *)((long)&inf + 4));
  bVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
          ::HasCurrentElement(&this->acceptignoreinfo);
  if (bVar2) {
    ppPVar3 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
              ::GetCurrentElement(&this->acceptignoreinfo);
    pPVar1 = *ppPVar3;
    if (inf._2_2_ == 0) {
      pPVar1->all = false;
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar1->portlist);
    }
    else {
      if ((pPVar1->all & 1U) == 0) {
        std::_List_iterator<unsigned_short>::_List_iterator(&begin_1);
        std::_List_iterator<unsigned_short>::_List_iterator(&end_1);
        std::_List_iterator<unsigned_short>::_List_iterator(&local_80);
        local_88 = (_List_node_base *)
                   std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                             (&pPVar1->portlist);
        end_1._M_node = local_88;
        local_90 = (_List_node_base *)
                   std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                             (&pPVar1->portlist);
        begin_1 = end_1;
        local_80._M_node = local_90;
        while( true ) {
          bVar2 = std::operator!=(&begin_1,&local_80);
          if (!bVar2) {
            return -0x57;
          }
          puVar5 = std::_List_iterator<unsigned_short>::operator*(&begin_1);
          if (*puVar5 == inf._2_2_) break;
          std::_List_iterator<unsigned_short>::operator++(&begin_1);
        }
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_98,&begin_1);
        std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::erase
                  (&pPVar1->portlist,local_98);
        return 0;
      }
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_40);
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     (&pPVar1->portlist);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_48,&local_50);
      end._M_node = local_48._M_node;
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                     (&pPVar1->portlist);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_58,&local_60);
      local_40._M_node = local_58._M_node;
      begin = end;
      while (bVar2 = std::operator!=(&begin,&local_40), bVar2) {
        puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin);
        if (*puVar4 == inf._2_2_) {
          return -0x57;
        }
        std::_List_const_iterator<unsigned_short>::operator++(&begin,0);
      }
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_front
                (&pPVar1->portlist,(value_type_conflict2 *)((long)&inf + 2));
    }
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -0x57;
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::ProcessDeleteAcceptIgnoreEntry(uint32_t ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (!acceptignoreinfo.HasCurrentElement())
		return ERR_RTP_UDPV4TRANS_NOSUCHENTRY;
	
	PortInfo *inf;

	inf = acceptignoreinfo.GetCurrentElement();
	if (port == 0) // delete all entries
	{
		inf->all = false;
		inf->portlist.clear();
	}
	else // a specific port was selected
	{
		if (inf->all) // currently, all ports are selected. Add the one to remove to the list
		{
			// we have to check if the list doesn't contain the port already
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list: this means we already deleted the entry
					return ERR_RTP_UDPV4TRANS_NOSUCHENTRY;
			}
			inf->portlist.push_front(port);
		}
		else // check if we can find the port in the list
		{
			std::list<uint16_t>::iterator it,begin,end;
			
			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; ++it)
			{
				if (*it == port) // found it!
				{
					inf->portlist.erase(it);
					return 0;
				}
			}
			// didn't find it
			return ERR_RTP_UDPV4TRANS_NOSUCHENTRY;			
		}
	}
	return 0;
}